

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall
kj::_::ExclusiveJoinPromiseNode::~ExclusiveJoinPromiseNode(ExclusiveJoinPromiseNode *this)

{
  ExclusiveJoinPromiseNode *this_local;
  
  Branch::~Branch(&this->right);
  Branch::~Branch(&this->left);
  PromiseNode::~PromiseNode(&this->super_PromiseNode);
  return;
}

Assistant:

ExclusiveJoinPromiseNode::~ExclusiveJoinPromiseNode() noexcept(false) {}